

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int rect_height_compare(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*(ushort *)((long)a + 6) <= *(ushort *)((long)b + 6)) &&
     (uVar1 = 1, *(ushort *)((long)b + 6) <= *(ushort *)((long)a + 6))) {
    uVar1 = 0xffffffff;
    if (*(ushort *)((long)a + 4) <= *(ushort *)((long)b + 4)) {
      uVar1 = (uint)(*(ushort *)((long)a + 4) < *(ushort *)((long)b + 4));
    }
  }
  return uVar1;
}

Assistant:

static int STBRP__CDECL rect_height_compare(const void *a, const void *b)
{
   const stbrp_rect *p = (const stbrp_rect *) a;
   const stbrp_rect *q = (const stbrp_rect *) b;
   if (p->h > q->h)
      return -1;
   if (p->h < q->h)
      return  1;
   return (p->w > q->w) ? -1 : (p->w < q->w);
}